

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITType.cpp
# Opt level: O0

void JITType::BuildFromJsType(Type *jsType,JITType *jitType)

{
  bool bVar1;
  BYTE BVar2;
  uint16 uVar3;
  TypeId TVar4;
  int iVar5;
  TypeIDL *pTVar6;
  JavascriptLibrary *ptr;
  RecyclableObject *ptr_00;
  JavascriptMethod p_Var7;
  TypePropertyCache *ptr_01;
  DynamicTypeHandler *this;
  DynamicTypeHandler *handler;
  DynamicType *dynamicType;
  TypeIDL *data;
  JITType *jitType_local;
  Type *jsType_local;
  
  pTVar6 = GetData(jitType);
  pTVar6->exists = '\x01';
  Memory::WriteBarrierPtr<void>::operator=(&pTVar6->addr,jsType);
  TVar4 = Js::Type::GetTypeId(jsType);
  pTVar6->typeId = TVar4;
  ptr = Js::Type::GetLibrary(jsType);
  Memory::WriteBarrierPtr<void>::operator=(&pTVar6->libAddr,ptr);
  ptr_00 = Js::Type::GetPrototype(jsType);
  Memory::WriteBarrierPtr<void>::operator=(&pTVar6->protoAddr,ptr_00);
  p_Var7 = Js::Type::GetEntryPoint(jsType);
  pTVar6->entrypointAddr = (Type)p_Var7;
  ptr_01 = Js::Type::GetPropertyCache(jsType);
  Memory::WriteBarrierPtr<void>::operator=(&pTVar6->propertyCacheAddr,ptr_01);
  bVar1 = Js::DynamicType::Is(jsType);
  if (bVar1) {
    bVar1 = Js::DynamicType::GetIsShared((DynamicType *)jsType);
    pTVar6->isShared = bVar1;
    this = Js::DynamicType::GetTypeHandler((DynamicType *)jsType);
    bVar1 = Js::DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(this);
    (pTVar6->handler).isObjectHeaderInlinedTypeHandler = bVar1;
    BVar2 = Js::DynamicTypeHandler::GetFlags(this);
    (pTVar6->handler).flags = BVar2;
    uVar3 = Js::DynamicTypeHandler::GetInlineSlotCapacity(this);
    (pTVar6->handler).inlineSlotCapacity = uVar3;
    uVar3 = Js::DynamicTypeHandler::GetOffsetOfInlineSlots(this);
    (pTVar6->handler).offsetOfInlineSlots = uVar3;
    iVar5 = Js::DynamicTypeHandler::GetSlotCapacity(this);
    (pTVar6->handler).slotCapacity = iVar5;
  }
  return;
}

Assistant:

void
JITType::BuildFromJsType(__in Js::Type * jsType, __out JITType * jitType)
{
    TypeIDL * data = jitType->GetData();
    data->exists = true;
    data->addr = jsType;
    data->typeId = jsType->GetTypeId();
    data->libAddr = jsType->GetLibrary();
    data->protoAddr = jsType->GetPrototype();
    data->entrypointAddr = (intptr_t)jsType->GetEntryPoint();
    data->propertyCacheAddr = jsType->GetPropertyCache();
    if (Js::DynamicType::Is(jsType))
    {
        Js::DynamicType * dynamicType = static_cast<Js::DynamicType*>(jsType);

        data->isShared = dynamicType->GetIsShared();

        Js::DynamicTypeHandler * handler = dynamicType->GetTypeHandler();
        data->handler.isObjectHeaderInlinedTypeHandler = handler->IsObjectHeaderInlinedTypeHandler();
        data->handler.flags = handler->GetFlags();
        data->handler.inlineSlotCapacity = handler->GetInlineSlotCapacity();
        data->handler.offsetOfInlineSlots = handler->GetOffsetOfInlineSlots();
        data->handler.slotCapacity = handler->GetSlotCapacity();
    }
}